

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robot.cpp
# Opt level: O1

void __thiscall Robot::setdimensionsABB(Robot *this)

{
  this->a1z = 0.0;
  this->a2x = 175.0;
  this->a2z = 495.0;
  this->a3z = 1095.0;
  this->a4x = 1230.5;
  this->a4z = 175.0;
  this->a5x = 0.0;
  this->a6x = 85.0;
  this->brand = ABB;
  return;
}

Assistant:

void Robot::setdimensionsABB(void){
    this->a1z = 0.0;
    this->a2x = 175.0;
    this->a2z = 495.0;
    this->a3z = 1095.0;
    this->a4x = 1230.5;
    this->a4z = 175.0;
    this->a5x = 0.0;
    this->a6x = 85.0;
    this->brand = ABB;
}